

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper.cpp
# Opt level: O0

void __thiscall cppcms::url_mapper::url_mapper(url_mapper *this,application *my_app)

{
  bool bVar1;
  data *pdVar2;
  cached_settings *pcVar3;
  application *in_RSI;
  noncopyable *in_RDI;
  data *in_stack_ffffffffffffffa0;
  
  booster::noncopyable::noncopyable(in_RDI);
  pdVar2 = (data *)operator_new(0xb8);
  data::data(in_stack_ffffffffffffffa0);
  booster::hold_ptr<cppcms::url_mapper::data>::hold_ptr
            ((hold_ptr<cppcms::url_mapper::data> *)in_RDI,pdVar2);
  pdVar2 = booster::hold_ptr<cppcms::url_mapper::data>::operator->
                     ((hold_ptr<cppcms::url_mapper::data> *)in_RDI);
  pdVar2->this_application = in_RSI;
  application::service((application *)0x3bbb16);
  pcVar3 = service::cached_settings((service *)0x3bbb27);
  bVar1 = (pcVar3->misc).invalid_url_throws;
  pdVar2 = booster::hold_ptr<cppcms::url_mapper::data>::operator->
                     ((hold_ptr<cppcms::url_mapper::data> *)in_RDI);
  pdVar2->throws = (bool)(bVar1 & 1);
  return;
}

Assistant:

url_mapper::url_mapper(cppcms::application *my_app) : d(new url_mapper::data())
	{
		d->this_application = my_app;
		d->throws = my_app->service().cached_settings().misc.invalid_url_throws;
	}